

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.h
# Opt level: O0

bool Intersect(btDbvtAabbMm *a,btDbvtAabbMm *b)

{
  float fVar1;
  btScalar *pbVar2;
  btVector3 *in_RSI;
  btVector3 *in_RDI;
  bool local_11;
  
  pbVar2 = btVector3::x(in_RDI);
  fVar1 = *pbVar2;
  pbVar2 = btVector3::x(in_RSI + 1);
  local_11 = false;
  if (fVar1 <= *pbVar2) {
    pbVar2 = btVector3::x(in_RDI + 1);
    fVar1 = *pbVar2;
    pbVar2 = btVector3::x(in_RSI);
    local_11 = false;
    if (*pbVar2 <= fVar1) {
      pbVar2 = btVector3::y(in_RDI);
      fVar1 = *pbVar2;
      pbVar2 = btVector3::y(in_RSI + 1);
      local_11 = false;
      if (fVar1 <= *pbVar2) {
        pbVar2 = btVector3::y(in_RDI + 1);
        fVar1 = *pbVar2;
        pbVar2 = btVector3::y(in_RSI);
        local_11 = false;
        if (*pbVar2 <= fVar1) {
          pbVar2 = btVector3::z(in_RDI);
          fVar1 = *pbVar2;
          pbVar2 = btVector3::z(in_RSI + 1);
          local_11 = false;
          if (fVar1 <= *pbVar2) {
            pbVar2 = btVector3::z(in_RDI + 1);
            fVar1 = *pbVar2;
            pbVar2 = btVector3::z(in_RSI);
            local_11 = *pbVar2 <= fVar1;
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

DBVT_INLINE bool		Intersect(	const btDbvtAabbMm& a,
								  const btDbvtAabbMm& b)
{
#if	DBVT_INT0_IMPL == DBVT_IMPL_SSE
	const __m128	rt(_mm_or_ps(	_mm_cmplt_ps(_mm_load_ps(b.mx),_mm_load_ps(a.mi)),
		_mm_cmplt_ps(_mm_load_ps(a.mx),_mm_load_ps(b.mi))));
#if defined (_WIN32)
	const __int32*	pu((const __int32*)&rt);
#else
    const int*	pu((const int*)&rt);
#endif
	return((pu[0]|pu[1]|pu[2])==0);
#else
	return(	(a.mi.x()<=b.mx.x())&&
		(a.mx.x()>=b.mi.x())&&
		(a.mi.y()<=b.mx.y())&&
		(a.mx.y()>=b.mi.y())&&
		(a.mi.z()<=b.mx.z())&&		
		(a.mx.z()>=b.mi.z()));
#endif
}